

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseGenericReply_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  allocator local_b9;
  shared_ptr<TgBot::GenericReply> local_b8;
  shared_ptr<TgBot::GenericReply> local_a8;
  shared_ptr<TgBot::GenericReply> local_98;
  shared_ptr<TgBot::GenericReply> local_88;
  shared_ptr<TgBot::GenericReply> local_78;
  shared_ptr<TgBot::GenericReply> local_68;
  Ptr local_58;
  shared_ptr<TgBot::ForceReply> local_48 [2];
  allocator local_21;
  Ptr *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  
  local_20 = object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    std::dynamic_pointer_cast<TgBot::ForceReply,TgBot::GenericReply>
              ((shared_ptr<TgBot::GenericReply> *)local_48);
    bVar1 = std::operator!=(local_48,(nullptr_t)0x0);
    std::shared_ptr<TgBot::ForceReply>::~shared_ptr(local_48);
    if (bVar1) {
      std::static_pointer_cast<TgBot::ForceReply,TgBot::GenericReply>
                ((shared_ptr<TgBot::GenericReply> *)&local_58);
      parseForceReply_abi_cxx11_(__return_storage_ptr__,this,&local_58);
      std::shared_ptr<TgBot::ForceReply>::~shared_ptr(&local_58);
    }
    else {
      std::dynamic_pointer_cast<TgBot::ReplyKeyboardRemove,TgBot::GenericReply>(&local_68);
      bVar1 = std::operator!=((shared_ptr<TgBot::ReplyKeyboardRemove> *)&local_68,(nullptr_t)0x0);
      std::shared_ptr<TgBot::ReplyKeyboardRemove>::~shared_ptr
                ((shared_ptr<TgBot::ReplyKeyboardRemove> *)&local_68);
      if (bVar1) {
        std::static_pointer_cast<TgBot::ReplyKeyboardRemove,TgBot::GenericReply>(&local_78);
        parseReplyKeyboardRemove_abi_cxx11_(__return_storage_ptr__,this,(Ptr *)&local_78);
        std::shared_ptr<TgBot::ReplyKeyboardRemove>::~shared_ptr
                  ((shared_ptr<TgBot::ReplyKeyboardRemove> *)&local_78);
      }
      else {
        std::dynamic_pointer_cast<TgBot::ReplyKeyboardMarkup,TgBot::GenericReply>(&local_88);
        bVar1 = std::operator!=((shared_ptr<TgBot::ReplyKeyboardMarkup> *)&local_88,(nullptr_t)0x0);
        std::shared_ptr<TgBot::ReplyKeyboardMarkup>::~shared_ptr
                  ((shared_ptr<TgBot::ReplyKeyboardMarkup> *)&local_88);
        if (bVar1) {
          std::static_pointer_cast<TgBot::ReplyKeyboardMarkup,TgBot::GenericReply>(&local_98);
          parseReplyKeyboardMarkup_abi_cxx11_(__return_storage_ptr__,this,(Ptr *)&local_98);
          std::shared_ptr<TgBot::ReplyKeyboardMarkup>::~shared_ptr
                    ((shared_ptr<TgBot::ReplyKeyboardMarkup> *)&local_98);
        }
        else {
          std::dynamic_pointer_cast<TgBot::InlineKeyboardMarkup,TgBot::GenericReply>(&local_a8);
          bVar1 = std::operator!=((shared_ptr<TgBot::InlineKeyboardMarkup> *)&local_a8,
                                  (nullptr_t)0x0);
          std::shared_ptr<TgBot::InlineKeyboardMarkup>::~shared_ptr
                    ((shared_ptr<TgBot::InlineKeyboardMarkup> *)&local_a8);
          if (bVar1) {
            std::static_pointer_cast<TgBot::InlineKeyboardMarkup,TgBot::GenericReply>(&local_b8);
            parseInlineKeyboardMarkup_abi_cxx11_(__return_storage_ptr__,this,(Ptr *)&local_b8);
            std::shared_ptr<TgBot::InlineKeyboardMarkup>::~shared_ptr
                      ((shared_ptr<TgBot::InlineKeyboardMarkup> *)&local_b8);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_b9);
            std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseGenericReply(const GenericReply::Ptr& object) const {
    if (!object) {
        return "";
    }
    if (dynamic_pointer_cast<ForceReply>(object) != nullptr) {
        return parseForceReply(static_pointer_cast<ForceReply>(object));
    } else if (dynamic_pointer_cast<ReplyKeyboardRemove>(object) != nullptr) {
        return parseReplyKeyboardRemove(static_pointer_cast<ReplyKeyboardRemove>(object));
    } else if (dynamic_pointer_cast<ReplyKeyboardMarkup>(object) != nullptr){
        return parseReplyKeyboardMarkup(static_pointer_cast<ReplyKeyboardMarkup>(object));
    } else if (dynamic_pointer_cast<InlineKeyboardMarkup>(object) != nullptr){
        return parseInlineKeyboardMarkup(static_pointer_cast<InlineKeyboardMarkup>(object));
    }
    return "";
}